

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

int __thiscall
KMaxDistance::putValToItsSortedPlace(KMaxDistance *this,double val,double *vals,int numVals)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  double *pdVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  
  uVar16 = 0;
  if (vals[(long)numVals + -1] < val) {
    bVar22 = 0 < numVals;
    if (0 < numVals) {
      uVar18 = (ulong)(uint)numVals;
      if (val <= *vals) {
        uVar20 = 1;
        do {
          uVar17 = uVar20;
          if (uVar18 == uVar17) {
            bVar22 = uVar17 < uVar18;
            goto LAB_0010417d;
          }
          uVar20 = uVar17 + 1;
        } while (val <= vals[uVar17]);
        bVar22 = uVar17 < uVar18;
      }
      else {
        uVar17 = 0;
      }
      if ((int)uVar17 < numVals + -1) {
        uVar20 = uVar18 - 2;
        if ((long)uVar17 < (long)(uVar18 - 2)) {
          uVar20 = uVar17;
        }
        pdVar19 = vals + (uVar18 - 8);
        auVar23 = vpbroadcastq_avx512f();
        uVar21 = 0;
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0x1020304050607));
        auVar23 = vpermq_avx512f(auVar25,auVar23);
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar26 = vporq_avx512f(auVar26,auVar24);
          auVar26 = vpermq_avx512f(auVar25,auVar26);
          uVar8 = vpcmpuq_avx512f(auVar26,auVar23,2);
          dVar9 = *pdVar19;
          dVar10 = pdVar19[1];
          dVar11 = pdVar19[2];
          dVar12 = pdVar19[3];
          dVar13 = pdVar19[4];
          dVar14 = pdVar19[5];
          dVar15 = pdVar19[6];
          bVar1 = (bool)((byte)uVar8 & 1);
          bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
          bVar3 = (bool)((byte)(uVar8 >> 2) & 1);
          bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
          bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
          bVar6 = (bool)((byte)(uVar8 >> 5) & 1);
          bVar7 = (bool)((byte)(uVar8 >> 6) & 1);
          *pdVar19 = (double)((ulong)bVar1 * (ulong)((byte)uVar8 & 1) * (long)pdVar19[-1] |
                             (ulong)!bVar1 * (long)*pdVar19);
          pdVar19[1] = (double)((ulong)bVar2 * (ulong)((byte)(uVar8 >> 1) & 1) * (long)dVar9 |
                               (ulong)!bVar2 * (long)pdVar19[1]);
          pdVar19[2] = (double)((ulong)bVar3 * (ulong)((byte)(uVar8 >> 2) & 1) * (long)dVar10 |
                               (ulong)!bVar3 * (long)pdVar19[2]);
          pdVar19[3] = (double)((ulong)bVar4 * (ulong)((byte)(uVar8 >> 3) & 1) * (long)dVar11 |
                               (ulong)!bVar4 * (long)pdVar19[3]);
          pdVar19[4] = (double)((ulong)bVar5 * (ulong)((byte)(uVar8 >> 4) & 1) * (long)dVar12 |
                               (ulong)!bVar5 * (long)pdVar19[4]);
          pdVar19[5] = (double)((ulong)bVar6 * (ulong)((byte)(uVar8 >> 5) & 1) * (long)dVar13 |
                               (ulong)!bVar6 * (long)pdVar19[5]);
          pdVar19[6] = (double)((ulong)bVar7 * (ulong)((byte)(uVar8 >> 6) & 1) * (long)dVar14 |
                               (ulong)!bVar7 * (long)pdVar19[6]);
          pdVar19[7] = (double)((uVar8 >> 7) * (uVar8 >> 7) * (long)dVar15 |
                               (ulong)!SUB81(uVar8 >> 7,0) * (long)pdVar19[7]);
          uVar21 = uVar21 + 8;
          pdVar19 = pdVar19 + -8;
        } while ((~uVar20 + 7 + uVar18 & 0xfffffffffffffff8) != uVar21);
      }
      vals[uVar17] = val;
    }
LAB_0010417d:
    uVar16 = (uint)bVar22;
  }
  return uVar16;
}

Assistant:

int KMaxDistance::putValToItsSortedPlace( const double val, double *vals, const int numVals ){
    if ( val <= vals[numVals-1] ) return 0;
    for ( int i = 0; i < numVals; ++i ){
        if ( vals[i] >= val ) continue;
        for ( int j = numVals-1; j > i; --j ) vals[j] = vals[j-1];
        vals[i] = val;
        return 1;
    }
    return 0;
}